

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O1

void mpr_add_n1_node_to_set(avl_tree *set,nhdp_neighbor *neigh,nhdp_link *lnk,uint32_t offset)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  undefined4 *puVar5;
  
  lVar4 = avl_find();
  if (lVar4 != 0) {
    return;
  }
  puVar5 = (undefined4 *)calloc(1,0x68);
  uVar1 = *(undefined4 *)((neigh->originator)._addr + 4);
  uVar2 = *(undefined4 *)((neigh->originator)._addr + 8);
  uVar3 = *(undefined4 *)((neigh->originator)._addr + 0xc);
  *puVar5 = *(undefined4 *)(neigh->originator)._addr;
  puVar5[1] = uVar1;
  puVar5[2] = uVar2;
  puVar5[3] = uVar3;
  *(undefined2 *)(puVar5 + 4) = *(undefined2 *)&(neigh->originator)._type;
  *(undefined4 **)(puVar5 + 0x14) = puVar5;
  *(nhdp_neighbor **)(puVar5 + 8) = neigh;
  *(nhdp_link **)(puVar5 + 6) = lnk;
  puVar5[0x18] = offset;
  avl_insert(set,puVar5 + 10);
  return;
}

Assistant:

void
mpr_add_n1_node_to_set(struct avl_tree *set, struct nhdp_neighbor *neigh, struct nhdp_link *lnk, uint32_t offset) {
  struct n1_node *tmp_n1_neigh;
  tmp_n1_neigh = avl_find_element(set, &neigh->originator, tmp_n1_neigh, _avl_node);
  if (tmp_n1_neigh) {
    return;
  }
  tmp_n1_neigh = calloc(1, sizeof(struct n1_node));
  tmp_n1_neigh->addr = neigh->originator;
  tmp_n1_neigh->_avl_node.key = &tmp_n1_neigh->addr;
  tmp_n1_neigh->neigh = neigh;
  tmp_n1_neigh->link = lnk;
  tmp_n1_neigh->table_offset = offset;
  avl_insert(set, &tmp_n1_neigh->_avl_node);
}